

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O0

void __thiscall TPZFileEqnStorage<long_double>::FinishWriting(TPZFileEqnStorage<long_double> *this)

{
  long in_RDI;
  
  fseek(*(FILE **)(in_RDI + 0xa0),4,0);
  fwrite((void *)(in_RDI + 0xb0),4,1,*(FILE **)(in_RDI + 0xa0));
  fclose(*(FILE **)(in_RDI + 0xa0));
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::FinishWriting()
{
#ifdef PZ_LOG
	if(logger.isDebugEnabled()) LOGPZ_DEBUG(logger,"Closing the binary file")
#endif
	fseek(fIOStream,sizeof(int),SEEK_SET);
	//cout << "Second fseek " << ftell(fIOStream) << endl;
	//fwrite(&fNumBlocks,sizeof(int),1,fIOStream);
	fwrite(&fNumBlocks,sizeof(int),1,fIOStream);
	fclose(fIOStream);
	fIOStream = 0;
}